

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_analysis.cc
# Opt level: O2

void __thiscall pass_check_function_return_Test::TestBody(pass_check_function_return_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  Generator *top;
  undefined1 local_1d8 [8];
  Context c;
  shared_ptr<kratos::Port> b;
  shared_ptr<kratos::Port> a;
  shared_ptr<kratos::FunctionStmtBlock> func;
  undefined1 local_80 [32];
  AssertHelper local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  kratos::Context::Context((Context *)local_1d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"mod",(allocator<char> *)local_80);
  top = kratos::Context::generator((Context *)local_1d8,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"test_func",(allocator<char> *)local_80);
  kratos::Generator::function
            ((Generator *)
             &a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (string *)top);
  std::__cxx11::string::~string((string *)local_50);
  _Var1 = a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"a",(allocator<char> *)local_80);
  (*(_Var1._M_pi)->_vptr__Sp_counted_base[0xd])
            (&b.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount,_Var1._M_pi
             ,local_50,1,0);
  std::__cxx11::string::~string((string *)local_50);
  _Var1 = a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"b",(allocator<char> *)local_80);
  (*(_Var1._M_pi)->_vptr__Sp_counted_base[0xd])
            (&c.tracked_generators_._M_h._M_single_bucket,_Var1._M_pi,local_50,1,0);
  std::__cxx11::string::~string((string *)local_50);
  _Var1 = a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Port,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_60,
             (__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
             &b.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  kratos::FunctionStmtBlock::return_stmt
            ((FunctionStmtBlock *)local_80,(shared_ptr<kratos::Var> *)_Var1._M_pi);
  local_50._0_8_ = local_80._0_8_;
  local_50._8_8_ = local_80._8_8_;
  local_80._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_80._8_8_ = (pointer)0x0;
  kratos::StmtBlock::add_stmt((StmtBlock *)_Var1._M_pi,(shared_ptr<kratos::Stmt> *)local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  _Var1 = a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Port,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_60,
             (__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
             &c.tracked_generators_._M_h._M_single_bucket);
  kratos::FunctionStmtBlock::return_stmt
            ((FunctionStmtBlock *)local_80,(shared_ptr<kratos::Var> *)_Var1._M_pi);
  local_50._0_8_ = local_80._0_8_;
  local_50._8_8_ = local_80._8_8_;
  local_80._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_80._8_8_ = (pointer)0x0;
  kratos::StmtBlock::add_stmt((StmtBlock *)_Var1._M_pi,(shared_ptr<kratos::Stmt> *)local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  local_40._M_allocated_capacity = 0;
  local_40._8_8_ = 0;
  local_50._8_8_ = 0;
  local_50._0_8_ = &local_40;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    kratos::check_function_return(top);
  }
  std::__cxx11::string::assign(local_50);
  testing::Message::Message((Message *)local_80);
  testing::internal::AssertHelper::AssertHelper
            (&local_60,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_analysis.cc"
             ,0x3c,(char *)local_50._0_8_);
  testing::internal::AssertHelper::operator=(&local_60,(Message *)local_80);
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(_func_int **)local_80._0_8_ + 8))();
  }
  std::__cxx11::string::~string((string *)local_50);
  (*(a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base[0xc])();
  _Var1 = a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Port,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_60,
             (__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
             &b.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  kratos::FunctionStmtBlock::return_stmt
            ((FunctionStmtBlock *)local_80,(shared_ptr<kratos::Var> *)_Var1._M_pi);
  local_50._0_8_ = local_80._0_8_;
  local_50._8_8_ = local_80._8_8_;
  local_80._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_80._8_8_ = (pointer)0x0;
  kratos::StmtBlock::add_stmt((StmtBlock *)_Var1._M_pi,(shared_ptr<kratos::Stmt> *)local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  local_40._M_allocated_capacity = 0;
  local_40._8_8_ = 0;
  local_50._8_8_ = 0;
  local_50._0_8_ = &local_40;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    kratos::check_function_return(top);
  }
  std::__cxx11::string::~string((string *)local_50);
  (*(a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base[0xc])();
  _Var1 = a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  kratos::Const::constant(1,1,false);
  kratos::Var::assign((Var *)local_80,
                      (Var *)b.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
  local_50._0_8_ = local_80._0_8_;
  local_50._8_8_ = local_80._8_8_;
  local_80._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_80._8_8_ = (pointer)0x0;
  kratos::StmtBlock::add_stmt((StmtBlock *)_Var1._M_pi,(shared_ptr<kratos::Stmt> *)local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Port,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_60,
             (__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
             &c.tracked_generators_._M_h._M_single_bucket);
  kratos::FunctionStmtBlock::return_stmt
            ((FunctionStmtBlock *)local_80,
             (shared_ptr<kratos::Var> *)
             a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  local_50._0_8_ = local_80._0_8_;
  local_50._8_8_ = local_80._8_8_;
  local_80._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_80._8_8_ = (pointer)0x0;
  kratos::StmtBlock::add_stmt
            ((StmtBlock *)
             a.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             (shared_ptr<kratos::Stmt> *)local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  local_40._M_allocated_capacity = 0;
  local_40._8_8_ = 0;
  local_50._8_8_ = 0;
  local_50._0_8_ = &local_40;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    kratos::check_function_return(top);
  }
  std::__cxx11::string::~string((string *)local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&b);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&a);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&func);
  kratos::Context::~Context((Context *)local_1d8);
  return;
}

Assistant:

TEST(pass, check_function_return) {  // NOLINT
    Context c;
    auto &mod = c.generator("mod");
    auto func = mod.function("test_func");
    auto a = func->input("a", 1, false);
    auto b = func->input("b", 1, false);
    func->add_stmt(func->return_stmt(a));
    func->add_stmt(func->return_stmt(b));

    EXPECT_THROW(check_function_return(&mod), StmtException);
    // clear the statements
    func->clear();
    func->add_stmt(func->return_stmt(a));
    EXPECT_NO_THROW(check_function_return(&mod));
    // clear the statements
    func->clear();
    func->add_stmt(a->assign(constant(1, 1)));
    func->add_stmt(func->return_stmt(b));
    EXPECT_NO_THROW(check_function_return(&mod));
}